

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType __thiscall ValueType::MergeWithObject(ValueType *this,ValueType other)

{
  code *pcVar1;
  bool bVar2;
  Bits BVar3;
  ObjectType OVar4;
  ObjectType OVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar6;
  ValueType VVar7;
  undefined4 *puVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_26;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  ObjectType local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType local_1c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  ObjectType typedArrayMergedObjectType;
  ValueType merged;
  ValueType *this_local;
  ValueType other_local;
  
  _typedArrayMergedObjectType = this;
  this_local._4_2_ = other.field_0;
  BVar3 = operator|((this->field_0).bits,(Bits)other.field_0);
  ValueType((ValueType *)&local_1a.field_0,BVar3);
  bVar2 = OneOn((ValueType *)&local_1a.field_0,Object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x417,"(merged.OneOn(Bits::Object))","merged.OneOn(Bits::Object)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  BVar3 = ::operator&((this->field_0).bits,this_local._4_2_);
  ValueType(&local_1c,BVar3);
  bVar2 = OneOn(&local_1c,Object);
  if (!bVar2) {
    bVar2 = OneOn(this,Object);
    if (bVar2) {
      bVar2 = CanMergeToObject((ValueType *)((long)&this_local + 4));
      if (!bVar2) {
        VVar7 = ToPrimitiveOrObject(this);
        BVar3 = operator|((Bits)VVar7.field_0,this_local._4_2_);
        VVar7 = Verify(BVar3);
        return (ValueType)VVar7.field_0.bits;
      }
      VVar7 = Verify((ValueType)local_1a.field_0);
      return (ValueType)VVar7.field_0.bits;
    }
    bVar2 = OneOn((ValueType *)((long)&this_local + 4),Object);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x444,"(other.OneOn(Bits::Object))","other.OneOn(Bits::Object)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar2 = CanMergeToObject(this);
    if (!bVar2) {
      BVar3 = (this->field_0).bits;
      VVar7 = ToPrimitiveOrObject((ValueType *)((long)&this_local + 4));
      BVar3 = operator|(BVar3,(Bits)VVar7.field_0);
      VVar7 = Verify(BVar3);
      return (ValueType)VVar7.field_0.bits;
    }
    VVar7 = Verify((ValueType)local_1a.field_0);
    return (ValueType)VVar7.field_0.bits;
  }
  OVar4 = GetObjectType(this);
  OVar5 = GetObjectType((ValueType *)((long)&this_local + 4));
  if (OVar4 == OVar5) {
    local_1e.field_0 = local_1a.field_0;
    VVar7 = Verify((ValueType)local_1a.field_0);
    return (ValueType)VVar7.field_0.bits;
  }
  OVar4 = GetObjectType(this);
  OVar5 = GetObjectType((ValueType *)((long)&this_local + 4));
  local_20 = TypedArrayMergeMap[OVar4][OVar5];
  if (local_20 == UninitializedObject) {
    OVar4 = GetObjectType(this);
    if ((OVar4 == UninitializedObject) ||
       (OVar4 = GetObjectType((ValueType *)((long)&this_local + 4)), OVar4 == UninitializedObject))
    {
      OVar4 = GetObjectType(this);
      if ((OVar4 < RegExp) &&
         (OVar4 = GetObjectType((ValueType *)((long)&this_local + 4)), OVar4 < RegExp)) {
        local_2a = local_1a;
      }
      else {
        local_2a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ToLikely((ValueType *)&local_1a.field_0);
      }
      aVar6.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           Verify(local_2a.field_0);
      return (anon_union_2_4_ea848c7b_for_ValueType_13)
             (anon_union_2_4_ea848c7b_for_ValueType_13)aVar6.field_0;
    }
    bVar2 = IsArrayOrObjectWithArray(this);
    if ((!bVar2) && (bVar2 = IsArrayOrObjectWithArray((ValueType *)((long)&this_local + 4)), !bVar2)
       ) {
      SetObjectType((ValueType *)&local_1a.field_0,Object);
      VVar7 = Verify((ValueType)local_1a.field_0);
      return (ValueType)VVar7.field_0.bits;
    }
    local_26.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)GetObject(Object);
    local_24.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ToLikely((ValueType *)&local_26.field_0);
    VVar7 = Verify((ValueType)local_24);
    return (ValueType)VVar7.field_0.bits;
  }
  SetObjectType((ValueType *)&local_1a.field_0,local_20);
  local_22.field_0 = local_1a.field_0;
  VVar7 = Verify((ValueType)local_1a.field_0);
  return (ValueType)VVar7.field_0.bits;
}

Assistant:

ValueType ValueType::MergeWithObject(const ValueType other) const
{
    ValueType merged(bits | other.bits);
    Assert(merged.OneOn(Bits::Object));

    if(ValueType(bits & other.bits).OneOn(Bits::Object)) // both have the Object bit set
    {
        if (GetObjectType() == other.GetObjectType())
            return Verify(merged);
        const ObjectType typedArrayMergedObjectType =
            TypedArrayMergeMap[static_cast<uint16>(GetObjectType())][static_cast<uint16>(other.GetObjectType())];
        if (typedArrayMergedObjectType != ObjectType::UninitializedObject)
        {
            merged.SetObjectType(typedArrayMergedObjectType);
            return Verify(merged);
        }
        if(GetObjectType() != ObjectType::UninitializedObject && other.GetObjectType() != ObjectType::UninitializedObject)
        {
            // Any two different specific object types (excludes UninitializedObject and Object, which don't indicate any
            // specific type of object) merge to Object since the resulting type is not guaranteed to indicate any specific type
            if (IsArrayOrObjectWithArray() || other.IsArrayOrObjectWithArray())
            {
                return Verify(GetObject(ObjectType::Object).ToLikely());
            }
            merged.SetObjectType(ObjectType::Object);
            return Verify(merged);
        }

        // Since UninitializedObject is a generic object type, when merged with a specific object type, the resulting object
        // type is not guaranteed to be any specific object type. However, since UninitializedObject means that we don't have
        // info about the object type, we can assume that the merged type is likely an object of the specific type.
        //
        // If both were definitely object, we lose the information that the merged type is also definitely object. For now
        // though, it's better to have "likely object of a specific type" than "definitely object of an unknown type". It may
        // eventually become necessary to distinguish these and have a "definitely object, likely of a specific type".
        return
            Verify(
                GetObjectType() > ObjectType::Object || other.GetObjectType() > ObjectType::Object
                    ? merged.ToLikely()
                    : merged);
    }

    if(OneOn(Bits::Object))
    {
        if(other.CanMergeToObject())
            return Verify(merged);
        return Verify(ToPrimitiveOrObject().bits | other.bits); // see ToPrimitiveOrObject
    }
    Assert(other.OneOn(Bits::Object));
    if(CanMergeToObject())
        return Verify(merged);
    return Verify(bits | other.ToPrimitiveOrObject().bits); // see ToPrimitiveOrObject
}